

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterBuildTestDyndepMissingAndNoRule::RegisterBuildTestDyndepMissingAndNoRule
          (RegisterBuildTestDyndepMissingAndNoRule *this)

{
  RegisterTest(BuildTestDyndepMissingAndNoRule::Create,"BuildTest.DyndepMissingAndNoRule");
  return;
}

Assistant:

TEST_F(BuildTest, DyndepMissingAndNoRule) {
  // Verify that we can diagnose when a dyndep file is missing and
  // has no rule to build it.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));

  string err;
  EXPECT_FALSE(builder_.AddTarget("out", &err));
  EXPECT_EQ("loading 'dd': No such file or directory", err);
}